

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void deqp::gls::ub::anon_unknown_12::generateCompareFuncs(ostream *str,ShaderInterface *interface)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  UniformBlock *pUVar3;
  char *__s;
  int vecSize;
  uint uVar4;
  pointer ppUVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  pointer ppUVar8;
  _Base_ptr p_Var9;
  pointer pUVar10;
  int type;
  int iVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> types;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> compareFuncs;
  DataType local_a0;
  _Rb_tree_color local_9c;
  ostream *local_98;
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  local_90;
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  iVar11 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppUVar5 = (interface->m_uniformBlocks).
            super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppUVar8 = (interface->m_uniformBlocks).
            super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)ppUVar8 - (long)ppUVar5) >> 3)) {
    lVar14 = 0;
    local_98 = str;
    do {
      pUVar3 = ppUVar5[lVar14];
      pUVar10 = (pUVar3->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pUVar10 !=
          *(pointer *)
           ((long)&(pUVar3->m_uniforms).
                   super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                   ._M_impl + 8)) {
        do {
          collectUniqueBasicTypes
                    ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *
                     )&local_90,&pUVar10->m_type);
          pUVar10 = pUVar10 + 1;
        } while (pUVar10 !=
                 *(pointer *)
                  ((long)&(pUVar3->m_uniforms).
                          super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                          ._M_impl + 8));
        ppUVar5 = (interface->m_uniformBlocks).
                  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppUVar8 = (interface->m_uniformBlocks).
                  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      str = local_98;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)((long)ppUVar8 - (long)ppUVar5) >> 3));
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_90._M_impl.super__Rb_tree_header) {
      p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_9c = p_Var6[1]._M_color;
        if (local_9c - 5 < 9) {
          local_a0 = TYPE_FLOAT;
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
          vecSize = glu::getDataTypeMatrixNumRows(local_9c);
          local_a0 = glu::getDataTypeFloatVec(vecSize);
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
        }
        else if (local_9c + ~_S_black < 3) {
          local_a0 = TYPE_FLOAT;
          std::
          _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
          ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
        }
        std::
        _Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
        ::_M_insert_unique<glu::DataType_const&>
                  ((_Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
                    *)&local_60,&local_9c);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header);
    }
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  do {
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      do {
        p_Var12 = p_Var13;
        p_Var9 = p_Var6;
        _Var2 = p_Var9[1]._M_color;
        p_Var13 = p_Var9;
        if ((int)_Var2 < iVar11) {
          p_Var13 = p_Var12;
        }
        p_Var6 = (&p_Var9->_M_left)[(int)_Var2 < iVar11];
      } while ((&p_Var9->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var13 != p_Var1) {
        if ((int)_Var2 < iVar11) {
          p_Var9 = p_Var12;
        }
        if ((int)p_Var9[1]._M_color <= iVar11) {
          uVar4 = iVar11 - 1;
          if ((uVar4 < 0x26) && ((0x3ffc001fffU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
            __s = (&PTR_anon_var_dwarf_4882e3a_0217b820)[uVar4];
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar7);
          }
          else {
            std::ios::clear((int)str + (int)str->_vptr_basic_ostream[-3]);
          }
        }
      }
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x5e);
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void generateCompareFuncs (std::ostream& str, const ShaderInterface& interface)
{
	std::set<glu::DataType> types;
	std::set<glu::DataType> compareFuncs;

	// Collect unique basic types
	collectUniqueBasicTypes(types, interface);

	// Set of compare functions required
	for (std::set<glu::DataType>::const_iterator iter = types.begin(); iter != types.end(); ++iter)
	{
		getCompareDependencies(compareFuncs, *iter);
	}

	for (int type = 0; type < glu::TYPE_LAST; ++type)
	{
		if (compareFuncs.find(glu::DataType(type)) != compareFuncs.end())
			str << getCompareFuncForType(glu::DataType(type));
	}
}